

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O2

void __thiscall highwayhash::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer ptVar1;
  thread *thread;
  pointer ptVar2;
  
  StartWorkers(this,0xffffffffffffffff);
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::_Function_base::~_Function_base(&(this->task_).super__Function_base);
  std::condition_variable::~condition_variable(&this->worker_start_cv_);
  std::condition_variable::~condition_variable(&this->workers_ready_cv_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool() {
    StartWorkers(kWorkerExit);

    for (std::thread& thread : threads_) {
      thread.join();
    }
  }